

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

DVector3 * __thiscall
AActor::GetPortalTransition
          (DVector3 *__return_storage_ptr__,AActor *this,double byoffset,sector_t **pSec)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  subsector_t *psVar5;
  sector_t_conflict *psVar6;
  ulong uVar7;
  double dVar8;
  double local_60;
  double local_48;
  double dStack_40;
  
  psVar6 = (sector_t_conflict *)this->Sector;
  local_60 = (this->__Pos).Z;
  dVar8 = byoffset + local_60;
  local_48 = (this->__Pos).X;
  dStack_40 = (this->__Pos).Y;
  if ((psVar6->planes[1].Flags & 0x1d0U) == 0x100) {
    uVar7 = (ulong)psVar6->Portals[1];
    dVar1 = sectorPortals.Array[uVar7].mPlaneZ;
    dVar2 = dVar1;
    while (dVar2 <= dVar8) {
      iVar3 = (sectorPortals.Array[uVar7].mDestination)->PortalGroup;
      iVar4 = this->Sector->PortalGroup;
      local_48 = 0.0;
      dStack_40 = 0.0;
      if (iVar4 != iVar3) {
        local_48 = Displacements.data.Array[iVar3 * Displacements.size + iVar4].pos.X;
        dStack_40 = Displacements.data.Array[iVar3 * Displacements.size + iVar4].pos.Y;
      }
      local_48 = (this->__Pos).X + local_48;
      dStack_40 = (this->__Pos).Y + dStack_40;
      local_60 = (this->__Pos).Z;
      psVar5 = P_PointInSubsector(local_48,dStack_40);
      psVar6 = psVar5->sector;
      if ((psVar6->planes[1].Flags & 0x1d0U) != 0x100) goto LAB_00425691;
      uVar7 = (ulong)psVar6->Portals[1];
      dVar2 = sectorPortals.Array[uVar7].mPlaneZ;
    }
    __return_storage_ptr__->Z = local_60;
    __return_storage_ptr__->X = local_48;
    __return_storage_ptr__->Y = dStack_40;
    if (dVar1 <= dVar8) goto LAB_004256a8;
  }
  if ((psVar6->planes[0].Flags & 0x1d0U) == 0x100) {
    uVar7 = (ulong)psVar6->Portals[0];
    dVar1 = sectorPortals.Array[uVar7].mPlaneZ;
    while (dVar8 < dVar1) {
      iVar3 = (sectorPortals.Array[uVar7].mDestination)->PortalGroup;
      iVar4 = this->Sector->PortalGroup;
      local_48 = 0.0;
      dStack_40 = 0.0;
      if (iVar4 != iVar3) {
        local_48 = Displacements.data.Array[iVar3 * Displacements.size + iVar4].pos.X;
        dStack_40 = Displacements.data.Array[iVar3 * Displacements.size + iVar4].pos.Y;
      }
      local_48 = (this->__Pos).X + local_48;
      dStack_40 = (this->__Pos).Y + dStack_40;
      local_60 = (this->__Pos).Z;
      psVar5 = P_PointInSubsector(local_48,dStack_40);
      psVar6 = psVar5->sector;
      if ((psVar6->planes[0].Flags & 0x1d0U) != 0x100) break;
      uVar7 = (ulong)psVar6->Portals[0];
      dVar1 = sectorPortals.Array[uVar7].mPlaneZ;
    }
  }
LAB_00425691:
  __return_storage_ptr__->Z = local_60;
  __return_storage_ptr__->X = local_48;
  __return_storage_ptr__->Y = dStack_40;
LAB_004256a8:
  if (pSec != (sector_t **)0x0) {
    *pSec = (sector_t *)psVar6;
  }
  return __return_storage_ptr__;
}

Assistant:

DVector3 AActor::GetPortalTransition(double byoffset, sector_t **pSec)
{
	bool moved = false;
	sector_t *sec = Sector;
	double testz = Z() + byoffset;
	DVector3 pos = Pos();

	while (!sec->PortalBlocksMovement(sector_t::ceiling))
	{
		if (testz >= sec->GetPortalPlaneZ(sector_t::ceiling))
		{
			pos = PosRelative(sec->GetOppositePortalGroup(sector_t::ceiling));
			sec = P_PointInSector(pos);
			moved = true;
		}
		else break;
	}
	if (!moved)
	{
		while (!sec->PortalBlocksMovement(sector_t::floor))
		{
			if (testz < sec->GetPortalPlaneZ(sector_t::floor))
			{
				pos = PosRelative(sec->GetOppositePortalGroup(sector_t::floor));
				sec = P_PointInSector(pos);
			}
			else break;
		}
	}
	if (pSec) *pSec = sec;
	return pos;
}